

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_gcd(mbedtls_mpi *G,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ulong uVar1;
  long lVar2;
  unsigned_short uVar3;
  int iVar4;
  mbedtls_mpi_uint *pmVar5;
  ulong uVar6;
  mbedtls_mpi *pmVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi local_70;
  mbedtls_mpi local_60;
  ulong local_50;
  mbedtls_mpi_uint local_48;
  mbedtls_mpi local_40;
  
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (ulong *)0x0;
  local_70.s = 1;
  local_70.n = 0;
  local_70.p = (ulong *)0x0;
  iVar4 = mbedtls_mpi_copy(&local_60,A);
  if (iVar4 == 0) {
    iVar4 = mbedtls_mpi_copy(&local_70,B);
    if (iVar4 == 0) {
      if (local_60.n != 0) {
        uVar10 = 0;
        lVar8 = 0;
        pmVar5 = local_60.p;
LAB_01d30e7b:
        uVar6 = *pmVar5;
        if (uVar6 == 0) goto code_r0x01d30e83;
        lVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar10 = lVar2 - lVar8;
        goto LAB_01d30ea1;
      }
      uVar10 = 0;
LAB_01d30ea1:
      if (local_70.n != 0) {
        uVar6 = 0;
        lVar8 = 0;
        pmVar5 = local_70.p;
LAB_01d30eb9:
        uVar1 = *pmVar5;
        if (uVar1 == 0) goto code_r0x01d30ec1;
        lVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar6 = lVar2 - lVar8;
        goto LAB_01d30ede;
      }
      uVar6 = 0;
LAB_01d30ede:
      if ((uVar6 != 0) || ((local_70.n != 0 && ((*local_70.p & 1) != 0)))) {
        local_50 = uVar10;
        if (uVar6 < uVar10) {
          local_50 = uVar6;
        }
        local_70.s = 1;
        local_60.s = 1;
        local_48 = 0;
        local_40.s = 1;
        local_40.n = 1;
        local_40.p = &local_48;
        iVar4 = mbedtls_mpi_cmp_mpi(&local_60,&local_40);
        if (iVar4 != 0) {
          do {
            uVar10 = (ulong)local_60.n;
            if (uVar10 != 0) {
              lVar8 = 0;
              pmVar5 = local_60.p;
LAB_01d30f4d:
              uVar6 = *pmVar5;
              if (uVar6 == 0) goto code_r0x01d30f55;
              lVar2 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                }
              }
              sVar9 = lVar2 - lVar8;
              goto LAB_01d30f70;
            }
LAB_01d30f65:
            sVar9 = 0;
LAB_01d30f70:
            if (uVar10 != 0) {
              mbedtls_mpi_core_shift_r(local_60.p,uVar10,sVar9);
            }
            uVar10 = (ulong)local_70.n;
            if (uVar10 != 0) {
              lVar8 = 0;
              pmVar5 = local_70.p;
LAB_01d30f95:
              uVar6 = *pmVar5;
              if (uVar6 == 0) goto code_r0x01d30f9d;
              lVar2 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                }
              }
              sVar9 = lVar2 - lVar8;
              goto LAB_01d30fb8;
            }
LAB_01d30fad:
            sVar9 = 0;
LAB_01d30fb8:
            if (uVar10 != 0) {
              mbedtls_mpi_core_shift_r(local_70.p,uVar10,sVar9);
            }
            iVar4 = mbedtls_mpi_cmp_mpi(&local_60,&local_70);
            if (iVar4 < 0) {
              iVar4 = mbedtls_mpi_sub_abs(&local_70,&local_70,&local_60);
              if (iVar4 != 0) goto LAB_01d3108d;
              pmVar7 = &local_70;
              uVar3 = local_70.n;
            }
            else {
              iVar4 = mbedtls_mpi_sub_abs(&local_60,&local_60,&local_70);
              if (iVar4 != 0) goto LAB_01d3108d;
              pmVar7 = &local_60;
              uVar3 = local_60.n;
            }
            if (uVar3 != 0) {
              mbedtls_mpi_core_shift_r(pmVar7->p,(ulong)uVar3,1);
            }
            local_48 = 0;
            local_40.s = 1;
            local_40.n = 1;
            local_40.p = &local_48;
            iVar4 = mbedtls_mpi_cmp_mpi(&local_60,&local_40);
          } while (iVar4 != 0);
        }
        iVar4 = mbedtls_mpi_shift_l(&local_70,local_50);
        if (iVar4 != 0) goto LAB_01d3108d;
        A = &local_70;
      }
      iVar4 = mbedtls_mpi_copy(G,A);
    }
  }
LAB_01d3108d:
  if (local_60.p != (ulong *)0x0) {
    mbedtls_zeroize_and_free(local_60.p,(ulong)local_60.n << 3);
  }
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  if (local_70.p != (ulong *)0x0) {
    mbedtls_zeroize_and_free(local_70.p,(ulong)local_70.n << 3);
  }
  return iVar4;
code_r0x01d30e83:
  lVar8 = lVar8 + -0x40;
  pmVar5 = pmVar5 + 1;
  if ((ulong)local_60.n * 0x40 + lVar8 == 0) goto LAB_01d30ea1;
  goto LAB_01d30e7b;
code_r0x01d30ec1:
  lVar8 = lVar8 + -0x40;
  pmVar5 = pmVar5 + 1;
  if ((ulong)local_70.n * 0x40 + lVar8 == 0) goto LAB_01d30ede;
  goto LAB_01d30eb9;
code_r0x01d30f55:
  lVar8 = lVar8 + -0x40;
  pmVar5 = pmVar5 + 1;
  if ((ulong)local_60.n * 0x40 + lVar8 == 0) goto LAB_01d30f65;
  goto LAB_01d30f4d;
code_r0x01d30f9d:
  lVar8 = lVar8 + -0x40;
  pmVar5 = pmVar5 + 1;
  if ((ulong)local_70.n * 0x40 + lVar8 == 0) goto LAB_01d30fad;
  goto LAB_01d30f95;
}

Assistant:

int mbedtls_mpi_gcd(mbedtls_mpi *G, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t lz, lzt;
    mbedtls_mpi TA, TB;

    mbedtls_mpi_init(&TA); mbedtls_mpi_init(&TB);

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TA, A));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, B));

    lz = mbedtls_mpi_lsb(&TA);
    lzt = mbedtls_mpi_lsb(&TB);

    /* The loop below gives the correct result when A==0 but not when B==0.
     * So have a special case for B==0. Leverage the fact that we just
     * calculated the lsb and lsb(B)==0 iff B is odd or 0 to make the test
     * slightly more efficient than cmp_int(). */
    if (lzt == 0 && mbedtls_mpi_get_bit(&TB, 0) == 0) {
        ret = mbedtls_mpi_copy(G, A);
        goto cleanup;
    }

    if (lzt < lz) {
        lz = lzt;
    }

    TA.s = TB.s = 1;

    /* We mostly follow the procedure described in HAC 14.54, but with some
     * minor differences:
     * - Sequences of multiplications or divisions by 2 are grouped into a
     *   single shift operation.
     * - The procedure in HAC assumes that 0 < TB <= TA.
     *     - The condition TB <= TA is not actually necessary for correctness.
     *       TA and TB have symmetric roles except for the loop termination
     *       condition, and the shifts at the beginning of the loop body
     *       remove any significance from the ordering of TA vs TB before
     *       the shifts.
     *     - If TA = 0, the loop goes through 0 iterations and the result is
     *       correctly TB.
     *     - The case TB = 0 was short-circuited above.
     *
     * For the correctness proof below, decompose the original values of
     * A and B as
     *   A = sa * 2^a * A' with A'=0 or A' odd, and sa = +-1
     *   B = sb * 2^b * B' with B'=0 or B' odd, and sb = +-1
     * Then gcd(A, B) = 2^{min(a,b)} * gcd(A',B'),
     * and gcd(A',B') is odd or 0.
     *
     * At the beginning, we have TA = |A| and TB = |B| so gcd(A,B) = gcd(TA,TB).
     * The code maintains the following invariant:
     *     gcd(A,B) = 2^k * gcd(TA,TB) for some k   (I)
     */

    /* Proof that the loop terminates:
     * At each iteration, either the right-shift by 1 is made on a nonzero
     * value and the nonnegative integer bitlen(TA) + bitlen(TB) decreases
     * by at least 1, or the right-shift by 1 is made on zero and then
     * TA becomes 0 which ends the loop (TB cannot be 0 if it is right-shifted
     * since in that case TB is calculated from TB-TA with the condition TB>TA).
     */
    while (mbedtls_mpi_cmp_int(&TA, 0) != 0) {
        /* Divisions by 2 preserve the invariant (I). */
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TA, mbedtls_mpi_lsb(&TA)));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TB, mbedtls_mpi_lsb(&TB)));

        /* Set either TA or TB to |TA-TB|/2. Since TA and TB are both odd,
         * TA-TB is even so the division by 2 has an integer result.
         * Invariant (I) is preserved since any odd divisor of both TA and TB
         * also divides |TA-TB|/2, and any odd divisor of both TA and |TA-TB|/2
         * also divides TB, and any odd divisor of both TB and |TA-TB|/2 also
         * divides TA.
         */
        if (mbedtls_mpi_cmp_mpi(&TA, &TB) >= 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(&TA, &TA, &TB));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TA, 1));
        } else {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(&TB, &TB, &TA));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TB, 1));
        }
        /* Note that one of TA or TB is still odd. */
    }

    /* By invariant (I), gcd(A,B) = 2^k * gcd(TA,TB) for some k.
     * At the loop exit, TA = 0, so gcd(TA,TB) = TB.
     * - If there was at least one loop iteration, then one of TA or TB is odd,
     *   and TA = 0, so TB is odd and gcd(TA,TB) = gcd(A',B'). In this case,
     *   lz = min(a,b) so gcd(A,B) = 2^lz * TB.
     * - If there was no loop iteration, then A was 0, and gcd(A,B) = B.
     *   In this case, lz = 0 and B = TB so gcd(A,B) = B = 2^lz * TB as well.
     */

    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&TB, lz));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(G, &TB));

cleanup:

    mbedtls_mpi_free(&TA); mbedtls_mpi_free(&TB);

    return ret;
}